

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtextures.c
# Opt level: O1

Vector3 ColorToHSV(Color color)

{
  undefined8 uVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  Vector3 VVar7;
  Vector3 VVar8;
  Vector3 VVar9;
  
  fVar4 = (float)((uint)color & 0xff) / 255.0;
  fVar3 = (float)((uint)color >> 8 & 0xff) / 255.0;
  fVar5 = (float)((uint)color >> 0x10 & 0xff) / 255.0;
  fVar6 = fVar4;
  if (fVar3 <= fVar4) {
    fVar6 = fVar3;
  }
  if (fVar5 <= fVar6) {
    fVar6 = fVar5;
  }
  fVar2 = fVar4;
  if (fVar4 <= fVar3) {
    fVar2 = fVar3;
  }
  if (fVar2 <= fVar5) {
    fVar2 = fVar5;
  }
  fVar6 = fVar2 - fVar6;
  uVar1 = 0;
  if (1e-05 <= fVar6) {
    if (fVar2 <= 0.0) {
      VVar8.z = fVar2;
      VVar8.x = NAN;
      VVar8.y = 0.0;
      return VVar8;
    }
    if (fVar2 <= fVar4) {
      fVar3 = (fVar3 - fVar5) / fVar6;
    }
    else if (fVar2 <= fVar3) {
      fVar3 = (fVar5 - fVar4) / fVar6 + 2.0;
    }
    else {
      fVar3 = (fVar4 - fVar3) / fVar6 + 4.0;
    }
    fVar3 = fVar3 * 60.0;
    uVar1 = CONCAT44(fVar6 / fVar2,fVar3);
    if (fVar3 < 0.0) {
      VVar9.y = fVar6 / fVar2;
      VVar9.x = fVar3 + 360.0;
      VVar9.z = fVar2;
      return VVar9;
    }
  }
  VVar7.z = fVar2;
  VVar7.x = (float)(int)uVar1;
  VVar7.y = (float)(int)((ulong)uVar1 >> 0x20);
  return VVar7;
}

Assistant:

Vector3 ColorToHSV(Color color)
{
    Vector3 hsv = { 0 };
    Vector3 rgb = { (float)color.r/255.0f, (float)color.g/255.0f, (float)color.b/255.0f };
    float min, max, delta;

    min = rgb.x < rgb.y? rgb.x : rgb.y;
    min = min  < rgb.z? min  : rgb.z;

    max = rgb.x > rgb.y? rgb.x : rgb.y;
    max = max  > rgb.z? max  : rgb.z;

    hsv.z = max;            // Value
    delta = max - min;

    if (delta < 0.00001f)
    {
        hsv.y = 0.0f;
        hsv.x = 0.0f;       // Undefined, maybe NAN?
        return hsv;
    }

    if (max > 0.0f)
    {
        // NOTE: If max is 0, this divide would cause a crash
        hsv.y = (delta/max);    // Saturation
    }
    else
    {
        // NOTE: If max is 0, then r = g = b = 0, s = 0, h is undefined
        hsv.y = 0.0f;
        hsv.x = NAN;        // Undefined
        return hsv;
    }

    // NOTE: Comparing float values could not work properly
    if (rgb.x >= max) hsv.x = (rgb.y - rgb.z)/delta;    // Between yellow & magenta
    else
    {
        if (rgb.y >= max) hsv.x = 2.0f + (rgb.z - rgb.x)/delta;  // Between cyan & yellow
        else hsv.x = 4.0f + (rgb.x - rgb.y)/delta;      // Between magenta & cyan
    }

    hsv.x *= 60.0f;     // Convert to degrees

    if (hsv.x < 0.0f) hsv.x += 360.0f;

    return hsv;
}